

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O0

void test_qpixl_frqi_compressedFRQICircuit<double>(void)

{
  allocator<double> *paVar1;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  double *pdVar2;
  vector<double,_std::allocator<double>_> *a_00;
  vector<double,_std::allocator<double>_> *a_01;
  vector<double,_std::allocator<double>_> *a_02;
  undefined1 local_210 [24];
  SquareMatrix<double> circC_check;
  QCircuit<double,_qclab::QObject<double>_> circC;
  double local_1b8 [8];
  iterator local_178;
  size_type local_170;
  undefined1 local_168 [8];
  vector<double,_std::allocator<double>_> c;
  undefined1 local_140 [8];
  SquareMatrix<double> circB_check;
  QCircuit<double,_qclab::QObject<double>_> circB;
  double local_f8 [4];
  iterator local_d8;
  size_type local_d0;
  undefined1 local_c8 [8];
  vector<double,_std::allocator<double>_> b;
  undefined1 local_a0 [8];
  SquareMatrix<double> circA_check;
  QCircuit<double,_qclab::QObject<double>_> circA;
  allocator<double> local_49;
  double local_48 [2];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<double,_std::allocator<double>_> a;
  double eps;
  
  a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)std::numeric_limits<double>::epsilon();
  local_48[0] = 0.5;
  local_48[1] = 1.0;
  local_38 = local_48;
  local_30 = 2;
  std::allocator<double>::allocator(&local_49);
  __l_01._M_len = local_30;
  __l_01._M_array = local_38;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_28,__l_01,&local_49);
  std::allocator<double>::~allocator(&local_49);
  qpixl::frqi::compressedFRQICircuit<std::vector<double,std::allocator<double>>>
            ((QCircuit<double,_qclab::QObject<double>_> *)&circA_check.data_,(frqi *)local_28,a_00,
             0.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)local_a0,0.620544580563746,-0.339005049421045,0.620544580563746
             ,-0.339005049421045,0.339005049421045,0.620544580563746,0.339005049421045,
             0.620544580563746,0.38205142437009,-0.595009839529386,-0.38205142437009,
             0.595009839529386,0.595009839529386,0.38205142437009,-0.595009839529386,
             -0.38205142437009);
  qclab::QCircuit<double,_qclab::QObject<double>_>::matrix
            ((QCircuit<double,_qclab::QObject<double>_> *)
             &b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  test_qpixl_frqi_check_matrix<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>,double>
            ((SquareMatrix<double> *)
             &b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(SquareMatrix<double> *)local_a0,2.220446049250313e-15);
  qclab::dense::SquareMatrix<double>::~SquareMatrix
            ((SquareMatrix<double> *)
             &b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  local_f8[2] = 1.5;
  local_f8[3] = 2.0;
  local_f8[0] = 0.5;
  local_f8[1] = 1.0;
  local_d8 = local_f8;
  local_d0 = 4;
  paVar1 = (allocator<double> *)
           ((long)&circB.gates_.
                   super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  __l_00._M_len = local_d0;
  __l_00._M_array = local_d8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_c8,__l_00,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&circB.gates_.
                     super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  qpixl::frqi::compressedFRQICircuit<std::vector<double,std::allocator<double>>>
            ((QCircuit<double,_qclab::QObject<double>_> *)&circB_check.data_,(frqi *)local_c8,a_01,
             0.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)local_140,8);
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,0,0);
  *pdVar2 = 0.438791280945186;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,1,0);
  *pdVar2 = 0.239712769302101;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,2,0);
  *pdVar2 = 0.27015115293407;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,3,0);
  *pdVar2 = 0.420735492403948;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,4,0);
  *pdVar2 = 0.035368600833851;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,5,0);
  *pdVar2 = 0.498747493302027;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,6,0);
  *pdVar2 = -0.208073418273571;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,7,0);
  *pdVar2 = 0.454648713412841;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,0,1);
  *pdVar2 = -0.239712769302101;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,1,1);
  *pdVar2 = 0.438791280945186;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,2,1);
  *pdVar2 = -0.420735492403948;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,3,1);
  *pdVar2 = 0.27015115293407;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,4,1);
  *pdVar2 = -0.498747493302027;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,5,1);
  *pdVar2 = 0.035368600833851;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,6,1);
  *pdVar2 = -0.454648713412841;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,7,1);
  *pdVar2 = -0.208073418273571;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,0,2);
  *pdVar2 = 0.438791280945186;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,1,2);
  *pdVar2 = 0.239712769302101;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,2,2);
  *pdVar2 = -0.27015115293407;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,3,2);
  *pdVar2 = -0.420735492403948;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,4,2);
  *pdVar2 = 0.035368600833851;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,5,2);
  *pdVar2 = 0.498747493302027;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,6,2);
  *pdVar2 = 0.208073418273571;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,7,2);
  *pdVar2 = -0.454648713412841;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,0,3);
  *pdVar2 = -0.239712769302101;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,1,3);
  *pdVar2 = 0.438791280945186;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,2,3);
  *pdVar2 = 0.420735492403948;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,3,3);
  *pdVar2 = -0.27015115293407;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,4,3);
  *pdVar2 = -0.498747493302027;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,5,3);
  *pdVar2 = 0.035368600833851;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,6,3);
  *pdVar2 = 0.454648713412841;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,7,3);
  *pdVar2 = 0.208073418273571;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,0,4);
  *pdVar2 = 0.438791280945186;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,1,4);
  *pdVar2 = 0.239712769302101;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,2,4);
  *pdVar2 = 0.27015115293407;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,3,4);
  *pdVar2 = 0.420735492403948;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,4,4);
  *pdVar2 = -0.035368600833851;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,5,4);
  *pdVar2 = -0.498747493302027;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,6,4);
  *pdVar2 = 0.208073418273571;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,7,4);
  *pdVar2 = -0.454648713412841;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,0,5);
  *pdVar2 = -0.239712769302101;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,1,5);
  *pdVar2 = 0.438791280945186;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,2,5);
  *pdVar2 = -0.420735492403948;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,3,5);
  *pdVar2 = 0.27015115293407;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,4,5);
  *pdVar2 = 0.498747493302027;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,5,5);
  *pdVar2 = -0.035368600833851;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,6,5);
  *pdVar2 = 0.454648713412841;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,7,5);
  *pdVar2 = 0.208073418273571;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,0,6);
  *pdVar2 = 0.438791280945186;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,1,6);
  *pdVar2 = 0.239712769302101;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,2,6);
  *pdVar2 = -0.27015115293407;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,3,6);
  *pdVar2 = -0.420735492403948;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,4,6);
  *pdVar2 = -0.035368600833851;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,5,6);
  *pdVar2 = -0.498747493302027;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,6,6);
  *pdVar2 = -0.208073418273571;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,7,6);
  *pdVar2 = 0.454648713412841;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,0,7);
  *pdVar2 = -0.239712769302101;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,1,7);
  *pdVar2 = 0.438791280945186;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,2,7);
  *pdVar2 = 0.420735492403948;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,3,7);
  *pdVar2 = -0.27015115293407;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,4,7);
  *pdVar2 = 0.498747493302027;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,5,7);
  *pdVar2 = -0.035368600833851;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,6,7);
  *pdVar2 = -0.454648713412841;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_140,7,7);
  *pdVar2 = -0.208073418273571;
  qclab::QCircuit<double,_qclab::QObject<double>_>::matrix
            ((QCircuit<double,_qclab::QObject<double>_> *)
             &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  test_qpixl_frqi_check_matrix<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>,double>
            ((SquareMatrix<double> *)
             &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(SquareMatrix<double> *)local_140,2.220446049250313e-15);
  qclab::dense::SquareMatrix<double>::~SquareMatrix
            ((SquareMatrix<double> *)
             &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  local_1b8[6] = 3.5;
  local_1b8[7] = 4.0;
  local_1b8[4] = 2.5;
  local_1b8[5] = 3.0;
  local_1b8[2] = 1.5;
  local_1b8[3] = 2.0;
  local_1b8[0] = 0.5;
  local_1b8[1] = 1.0;
  local_178 = local_1b8;
  local_170 = 8;
  paVar1 = (allocator<double> *)
           ((long)&circC.gates_.
                   super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  __l._M_len = local_170;
  __l._M_array = local_178;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_168,__l,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&circC.gates_.
                     super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  qpixl::frqi::compressedFRQICircuit<std::vector<double,std::allocator<double>>>
            ((QCircuit<double,_qclab::QObject<double>_> *)&circC_check.data_,(frqi *)local_168,a_02,
             0.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)(local_210 + 0x10),0x10);
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0,0);
  *pdVar2 = 0.310272290281873;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),1,0);
  *pdVar2 = 0.169502524710522;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),2,0);
  *pdVar2 = 0.191025712185045;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),3,0);
  *pdVar2 = 0.297504919764693;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),4,0);
  *pdVar2 = 0.025009377490697;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),5,0);
  *pdVar2 = 0.352667734613656;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),6,0);
  *pdVar2 = -0.147130125045907;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),7,0);
  *pdVar2 = 0.321485188311959;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),8,0);
  *pdVar2 = -0.283247041628773;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),9,0);
  *pdVar2 = 0.21159185572358;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),10,0);
  *pdVar2 = -0.350015203834987;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xb,0);
  *pdVar2 = 0.049893457330116;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xc,0);
  *pdVar2 = -0.331087436935406;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xd,0);
  *pdVar2 = -0.124020599512917;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xe,0);
  *pdVar2 = -0.231097918395994;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xf,0);
  *pdVar2 = -0.267570088225568;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0,1);
  *pdVar2 = -0.169502524710522;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),1,1);
  *pdVar2 = 0.310272290281873;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),2,1);
  *pdVar2 = -0.297504919764693;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),3,1);
  *pdVar2 = 0.191025712185045;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),4,1);
  *pdVar2 = -0.352667734613656;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),5,1);
  *pdVar2 = 0.025009377490697;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),6,1);
  *pdVar2 = -0.321485188311959;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),7,1);
  *pdVar2 = -0.147130125045907;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),8,1);
  *pdVar2 = -0.21159185572358;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),9,1);
  *pdVar2 = -0.283247041628773;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),10,1);
  *pdVar2 = -0.049893457330116;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xb,1);
  *pdVar2 = -0.350015203834987;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xc,1);
  *pdVar2 = 0.124020599512917;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xd,1);
  *pdVar2 = -0.331087436935406;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xe,1);
  *pdVar2 = 0.267570088225568;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xf,1);
  *pdVar2 = -0.231097918395994;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0,2);
  *pdVar2 = 0.310272290281873;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),1,2);
  *pdVar2 = 0.169502524710522;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),2,2);
  *pdVar2 = -0.191025712185045;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),3,2);
  *pdVar2 = -0.297504919764693;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),4,2);
  *pdVar2 = 0.025009377490697;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),5,2);
  *pdVar2 = 0.352667734613656;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),6,2);
  *pdVar2 = 0.147130125045907;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),7,2);
  *pdVar2 = -0.321485188311959;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),8,2);
  *pdVar2 = -0.283247041628773;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),9,2);
  *pdVar2 = 0.21159185572358;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),10,2);
  *pdVar2 = 0.350015203834987;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xb,2);
  *pdVar2 = -0.049893457330116;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xc,2);
  *pdVar2 = -0.331087436935406;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xd,2);
  *pdVar2 = -0.124020599512917;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xe,2);
  *pdVar2 = 0.231097918395994;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xf,2);
  *pdVar2 = 0.267570088225568;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0,3);
  *pdVar2 = -0.169502524710522;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),1,3);
  *pdVar2 = 0.310272290281873;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),2,3);
  *pdVar2 = 0.297504919764693;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),3,3);
  *pdVar2 = -0.191025712185045;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),4,3);
  *pdVar2 = -0.352667734613656;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),5,3);
  *pdVar2 = 0.025009377490697;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),6,3);
  *pdVar2 = 0.321485188311959;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),7,3);
  *pdVar2 = 0.147130125045907;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),8,3);
  *pdVar2 = -0.21159185572358;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),9,3);
  *pdVar2 = -0.283247041628773;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),10,3);
  *pdVar2 = 0.049893457330116;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xb,3);
  *pdVar2 = 0.350015203834987;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xc,3);
  *pdVar2 = 0.124020599512917;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xd,3);
  *pdVar2 = -0.331087436935406;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xe,3);
  *pdVar2 = -0.267570088225568;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xf,3);
  *pdVar2 = 0.231097918395994;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0,4);
  *pdVar2 = 0.310272290281873;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),1,4);
  *pdVar2 = 0.169502524710522;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),2,4);
  *pdVar2 = 0.191025712185045;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),3,4);
  *pdVar2 = 0.297504919764693;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),4,4);
  *pdVar2 = -0.025009377490697;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),5,4);
  *pdVar2 = -0.352667734613656;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),6,4);
  *pdVar2 = 0.147130125045907;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),7,4);
  *pdVar2 = -0.321485188311959;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),8,4);
  *pdVar2 = -0.283247041628773;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),9,4);
  *pdVar2 = 0.21159185572358;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),10,4);
  *pdVar2 = -0.350015203834987;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xb,4);
  *pdVar2 = 0.049893457330116;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xc,4);
  *pdVar2 = 0.331087436935406;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xd,4);
  *pdVar2 = 0.124020599512917;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xe,4);
  *pdVar2 = 0.231097918395994;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xf,4);
  *pdVar2 = 0.267570088225568;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0,5);
  *pdVar2 = -0.169502524710522;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),1,5);
  *pdVar2 = 0.310272290281873;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),2,5);
  *pdVar2 = -0.297504919764693;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),3,5);
  *pdVar2 = 0.191025712185045;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),4,5);
  *pdVar2 = 0.352667734613656;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),5,5);
  *pdVar2 = -0.025009377490697;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),6,5);
  *pdVar2 = 0.321485188311959;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),7,5);
  *pdVar2 = 0.147130125045907;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),8,5);
  *pdVar2 = -0.21159185572358;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),9,5);
  *pdVar2 = -0.283247041628773;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),10,5);
  *pdVar2 = -0.049893457330116;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xb,5);
  *pdVar2 = -0.350015203834987;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xc,5);
  *pdVar2 = -0.124020599512917;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xd,5);
  *pdVar2 = 0.331087436935406;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xe,5);
  *pdVar2 = -0.267570088225568;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xf,5);
  *pdVar2 = 0.231097918395994;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0,6);
  *pdVar2 = 0.310272290281873;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),1,6);
  *pdVar2 = 0.169502524710522;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),2,6);
  *pdVar2 = -0.191025712185045;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),3,6);
  *pdVar2 = -0.297504919764693;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),4,6);
  *pdVar2 = -0.025009377490697;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),5,6);
  *pdVar2 = -0.352667734613656;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),6,6);
  *pdVar2 = -0.147130125045907;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),7,6);
  *pdVar2 = 0.321485188311959;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),8,6);
  *pdVar2 = -0.283247041628773;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),9,6);
  *pdVar2 = 0.21159185572358;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),10,6);
  *pdVar2 = 0.350015203834987;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xb,6);
  *pdVar2 = -0.049893457330116;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xc,6);
  *pdVar2 = 0.331087436935406;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xd,6);
  *pdVar2 = 0.124020599512917;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xe,6);
  *pdVar2 = -0.231097918395994;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xf,6);
  *pdVar2 = -0.267570088225568;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0,7);
  *pdVar2 = -0.169502524710522;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),1,7);
  *pdVar2 = 0.310272290281873;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),2,7);
  *pdVar2 = 0.297504919764693;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),3,7);
  *pdVar2 = -0.191025712185045;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),4,7);
  *pdVar2 = 0.352667734613656;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),5,7);
  *pdVar2 = -0.025009377490697;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),6,7);
  *pdVar2 = -0.321485188311959;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),7,7);
  *pdVar2 = -0.147130125045907;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),8,7);
  *pdVar2 = -0.21159185572358;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),9,7);
  *pdVar2 = -0.283247041628773;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),10,7);
  *pdVar2 = 0.049893457330116;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xb,7);
  *pdVar2 = 0.350015203834987;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xc,7);
  *pdVar2 = -0.124020599512917;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xd,7);
  *pdVar2 = 0.331087436935406;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xe,7);
  *pdVar2 = 0.267570088225568;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xf,7);
  *pdVar2 = -0.231097918395994;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0,8);
  *pdVar2 = 0.310272290281873;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),1,8);
  *pdVar2 = 0.169502524710522;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),2,8);
  *pdVar2 = 0.191025712185045;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),3,8);
  *pdVar2 = 0.297504919764693;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),4,8);
  *pdVar2 = 0.025009377490697;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),5,8);
  *pdVar2 = 0.352667734613656;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),6,8);
  *pdVar2 = -0.147130125045907;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),7,8);
  *pdVar2 = 0.321485188311959;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),8,8);
  *pdVar2 = 0.283247041628773;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),9,8);
  *pdVar2 = -0.21159185572358;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),10,8);
  *pdVar2 = 0.350015203834987;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xb,8);
  *pdVar2 = -0.049893457330116;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xc,8);
  *pdVar2 = 0.331087436935406;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xd,8);
  *pdVar2 = 0.124020599512917;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xe,8);
  *pdVar2 = 0.231097918395994;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xf,8);
  *pdVar2 = 0.267570088225568;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0,9);
  *pdVar2 = -0.169502524710522;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),1,9);
  *pdVar2 = 0.310272290281873;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),2,9);
  *pdVar2 = -0.297504919764693;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),3,9);
  *pdVar2 = 0.191025712185045;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),4,9);
  *pdVar2 = -0.352667734613656;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),5,9);
  *pdVar2 = 0.025009377490697;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),6,9);
  *pdVar2 = -0.321485188311959;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),7,9);
  *pdVar2 = -0.147130125045907;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),8,9);
  *pdVar2 = 0.21159185572358;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),9,9);
  *pdVar2 = 0.283247041628773;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),10,9);
  *pdVar2 = 0.049893457330116;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xb,9);
  *pdVar2 = 0.350015203834987;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xc,9);
  *pdVar2 = -0.124020599512917;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xd,9);
  *pdVar2 = 0.331087436935406;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xe,9);
  *pdVar2 = -0.267570088225568;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xf,9);
  *pdVar2 = 0.231097918395994;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0,10);
  *pdVar2 = 0.310272290281873;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),1,10);
  *pdVar2 = 0.169502524710522;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),2,10);
  *pdVar2 = -0.191025712185045;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),3,10);
  *pdVar2 = -0.297504919764693;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),4,10);
  *pdVar2 = 0.025009377490697;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),5,10);
  *pdVar2 = 0.352667734613656;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),6,10);
  *pdVar2 = 0.147130125045907;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),7,10);
  *pdVar2 = -0.321485188311959;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),8,10);
  *pdVar2 = 0.283247041628773;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),9,10);
  *pdVar2 = -0.21159185572358;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),10,10);
  *pdVar2 = -0.350015203834987;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xb,10);
  *pdVar2 = 0.049893457330116;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xc,10);
  *pdVar2 = 0.331087436935406;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xd,10);
  *pdVar2 = 0.124020599512917;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xe,10);
  *pdVar2 = -0.231097918395994;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xf,10);
  *pdVar2 = -0.267570088225568;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0,0xb);
  *pdVar2 = -0.169502524710522;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),1,0xb);
  *pdVar2 = 0.310272290281873;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),2,0xb);
  *pdVar2 = 0.297504919764693;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),3,0xb);
  *pdVar2 = -0.191025712185045;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),4,0xb);
  *pdVar2 = -0.352667734613656;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),5,0xb);
  *pdVar2 = 0.025009377490697;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),6,0xb);
  *pdVar2 = 0.321485188311959;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),7,0xb);
  *pdVar2 = 0.147130125045907;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),8,0xb);
  *pdVar2 = 0.21159185572358;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),9,0xb);
  *pdVar2 = 0.283247041628773;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),10,0xb);
  *pdVar2 = -0.049893457330116;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xb,0xb);
  *pdVar2 = -0.350015203834987;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xc,0xb);
  *pdVar2 = -0.124020599512917;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xd,0xb);
  *pdVar2 = 0.331087436935406;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xe,0xb);
  *pdVar2 = 0.267570088225568;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xf,0xb);
  *pdVar2 = -0.231097918395994;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0,0xc);
  *pdVar2 = 0.310272290281873;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),1,0xc);
  *pdVar2 = 0.169502524710522;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),2,0xc);
  *pdVar2 = 0.191025712185045;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),3,0xc);
  *pdVar2 = 0.297504919764693;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),4,0xc);
  *pdVar2 = -0.025009377490697;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),5,0xc);
  *pdVar2 = -0.352667734613656;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),6,0xc);
  *pdVar2 = 0.147130125045907;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),7,0xc);
  *pdVar2 = -0.321485188311959;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),8,0xc);
  *pdVar2 = 0.283247041628773;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),9,0xc);
  *pdVar2 = -0.21159185572358;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),10,0xc);
  *pdVar2 = 0.350015203834987;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xb,0xc);
  *pdVar2 = -0.049893457330116;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xc,0xc);
  *pdVar2 = -0.331087436935406;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xd,0xc);
  *pdVar2 = -0.124020599512917;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xe,0xc);
  *pdVar2 = -0.231097918395994;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xf,0xc);
  *pdVar2 = -0.267570088225568;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0,0xd);
  *pdVar2 = -0.169502524710522;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),1,0xd);
  *pdVar2 = 0.310272290281873;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),2,0xd);
  *pdVar2 = -0.297504919764693;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),3,0xd);
  *pdVar2 = 0.191025712185045;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),4,0xd);
  *pdVar2 = 0.352667734613656;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),5,0xd);
  *pdVar2 = -0.025009377490697;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),6,0xd);
  *pdVar2 = 0.321485188311959;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),7,0xd);
  *pdVar2 = 0.147130125045907;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),8,0xd);
  *pdVar2 = 0.21159185572358;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),9,0xd);
  *pdVar2 = 0.283247041628773;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),10,0xd);
  *pdVar2 = 0.049893457330116;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xb,0xd);
  *pdVar2 = 0.350015203834987;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xc,0xd);
  *pdVar2 = 0.124020599512917;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xd,0xd);
  *pdVar2 = -0.331087436935406;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xe,0xd);
  *pdVar2 = 0.267570088225568;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xf,0xd);
  *pdVar2 = -0.231097918395994;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0,0xe);
  *pdVar2 = 0.310272290281873;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),1,0xe);
  *pdVar2 = 0.169502524710522;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),2,0xe);
  *pdVar2 = -0.191025712185045;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),3,0xe);
  *pdVar2 = -0.297504919764693;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),4,0xe);
  *pdVar2 = -0.025009377490697;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),5,0xe);
  *pdVar2 = -0.352667734613656;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),6,0xe);
  *pdVar2 = -0.147130125045907;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),7,0xe);
  *pdVar2 = 0.321485188311959;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),8,0xe);
  *pdVar2 = 0.283247041628773;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),9,0xe);
  *pdVar2 = -0.21159185572358;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),10,0xe);
  *pdVar2 = -0.350015203834987;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xb,0xe);
  *pdVar2 = 0.049893457330116;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xc,0xe);
  *pdVar2 = -0.331087436935406;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xd,0xe);
  *pdVar2 = -0.124020599512917;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xe,0xe);
  *pdVar2 = 0.231097918395994;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xf,0xe);
  *pdVar2 = 0.267570088225568;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0,0xf);
  *pdVar2 = -0.169502524710522;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),1,0xf);
  *pdVar2 = 0.310272290281873;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),2,0xf);
  *pdVar2 = 0.297504919764693;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),3,0xf);
  *pdVar2 = -0.191025712185045;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),4,0xf);
  *pdVar2 = 0.352667734613656;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),5,0xf);
  *pdVar2 = -0.025009377490697;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),6,0xf);
  *pdVar2 = -0.321485188311959;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),7,0xf);
  *pdVar2 = -0.147130125045907;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),8,0xf);
  *pdVar2 = 0.21159185572358;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),9,0xf);
  *pdVar2 = 0.283247041628773;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),10,0xf);
  *pdVar2 = -0.049893457330116;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xb,0xf);
  *pdVar2 = -0.350015203834987;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xc,0xf);
  *pdVar2 = 0.124020599512917;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xd,0xf);
  *pdVar2 = -0.331087436935406;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xe,0xf);
  *pdVar2 = -0.267570088225568;
  pdVar2 = qclab::dense::SquareMatrix<double>::operator()
                     ((SquareMatrix<double> *)(local_210 + 0x10),0xf,0xf);
  *pdVar2 = 0.231097918395994;
  qclab::QCircuit<double,_qclab::QObject<double>_>::matrix
            ((QCircuit<double,_qclab::QObject<double>_> *)local_210);
  test_qpixl_frqi_check_matrix<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>,double>
            ((SquareMatrix<double> *)local_210,(SquareMatrix<double> *)(local_210 + 0x10),
             2.220446049250313e-15);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)local_210);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)(local_210 + 0x10));
  qclab::QCircuit<double,_qclab::QObject<double>_>::~QCircuit
            ((QCircuit<double,_qclab::QObject<double>_> *)&circC_check.data_);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_168);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)local_140);
  qclab::QCircuit<double,_qclab::QObject<double>_>::~QCircuit
            ((QCircuit<double,_qclab::QObject<double>_> *)&circB_check.data_);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_c8);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)local_a0);
  qclab::QCircuit<double,_qclab::QObject<double>_>::~QCircuit
            ((QCircuit<double,_qclab::QObject<double>_> *)&circA_check.data_);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_28);
  return;
}

Assistant:

void test_qpixl_frqi_compressedFRQICircuit() {
  const R eps = std::numeric_limits< R >::epsilon() ;

  std::vector< R > a = { 0.5 , 1 } ;

  auto circA = qpixl::frqi::compressedFRQICircuit( a ) ;

  // matrix
  qclab::dense::SquareMatrix< R > circA_check(    
  0.620544580563746, -0.339005049421045,  0.620544580563746, -0.339005049421045,
  0.339005049421045,  0.620544580563746,  0.339005049421045,  0.620544580563746,
  0.382051424370090, -0.595009839529386, -0.382051424370090,  0.595009839529386,
  0.595009839529386,  0.382051424370090, -0.595009839529386, -0.382051424370090
  ) ;

  test_qpixl_frqi_check_matrix( circA.matrix() , circA_check  , 10*eps );
  
  
  std::vector< R > b = { 0.5 , 1 , 1.5 , 2 };

  auto circB = qpixl::frqi::compressedFRQICircuit( b ) ;

  // matrix
  qclab::dense::SquareMatrix< R > circB_check( 8 ) ;

  circB_check( 0, 0 ) =  0.438791280945186 ;
  circB_check( 1, 0 ) =  0.239712769302101 ;
  circB_check( 2, 0 ) =  0.270151152934070 ;
  circB_check( 3, 0 ) =  0.420735492403948 ;
  circB_check( 4, 0 ) =  0.035368600833851 ;
  circB_check( 5, 0 ) =  0.498747493302027 ;
  circB_check( 6, 0 ) = -0.208073418273571 ;
  circB_check( 7, 0 ) =  0.454648713412841 ;

  circB_check( 0, 1 ) = -0.239712769302101 ;
  circB_check( 1, 1 ) =  0.438791280945186 ;
  circB_check( 2, 1 ) = -0.420735492403948 ;
  circB_check( 3, 1 ) =  0.270151152934070 ;
  circB_check( 4, 1 ) = -0.498747493302027 ;
  circB_check( 5, 1 ) =  0.035368600833851 ;
  circB_check( 6, 1 ) = -0.454648713412841 ;
  circB_check( 7, 1 ) = -0.208073418273571 ;

  circB_check( 0, 2 ) =  0.438791280945186 ;
  circB_check( 1, 2 ) =  0.239712769302101 ;
  circB_check( 2, 2 ) = -0.270151152934070 ;
  circB_check( 3, 2 ) = -0.420735492403948 ;
  circB_check( 4, 2 ) =  0.035368600833851 ;
  circB_check( 5, 2 ) =  0.498747493302027 ;
  circB_check( 6, 2 ) =  0.208073418273571 ;
  circB_check( 7, 2 ) = -0.454648713412841 ;

  circB_check( 0, 3 ) = -0.239712769302101 ;
  circB_check( 1, 3 ) =  0.438791280945186 ;
  circB_check( 2, 3 ) =  0.420735492403948 ;
  circB_check( 3, 3 ) = -0.270151152934070 ;
  circB_check( 4, 3 ) = -0.498747493302027 ;
  circB_check( 5, 3 ) =  0.035368600833851 ;
  circB_check( 6, 3 ) =  0.454648713412841 ;
  circB_check( 7, 3 ) =  0.208073418273571 ;

  circB_check( 0, 4 ) =  0.438791280945186 ;
  circB_check( 1, 4 ) =  0.239712769302101 ;
  circB_check( 2, 4 ) =  0.270151152934070 ;
  circB_check( 3, 4 ) =  0.420735492403948 ;
  circB_check( 4, 4 ) = -0.035368600833851 ;
  circB_check( 5, 4 ) = -0.498747493302027 ;
  circB_check( 6, 4 ) =  0.208073418273571 ;
  circB_check( 7, 4 ) = -0.454648713412841 ;

  circB_check( 0, 5 ) = -0.239712769302101 ;
  circB_check( 1, 5 ) =  0.438791280945186 ;
  circB_check( 2, 5 ) = -0.420735492403948 ;
  circB_check( 3, 5 ) =  0.270151152934070 ;
  circB_check( 4, 5 ) =  0.498747493302027 ;
  circB_check( 5, 5 ) = -0.035368600833851 ;
  circB_check( 6, 5 ) =  0.454648713412841 ;
  circB_check( 7, 5 ) =  0.208073418273571 ;

  circB_check( 0, 6 ) =  0.438791280945186 ;
  circB_check( 1, 6 ) =  0.239712769302101 ;
  circB_check( 2, 6 ) = -0.270151152934070 ;
  circB_check( 3, 6 ) = -0.420735492403948 ;
  circB_check( 4, 6 ) = -0.035368600833851 ;
  circB_check( 5, 6 ) = -0.498747493302027 ;
  circB_check( 6, 6 ) = -0.208073418273571 ;
  circB_check( 7, 6 ) =  0.454648713412841 ;

  circB_check( 0, 7 ) = -0.239712769302101 ;
  circB_check( 1, 7 ) =  0.438791280945186 ;
  circB_check( 2, 7 ) =  0.420735492403948 ;
  circB_check( 3, 7 ) = -0.270151152934070 ;
  circB_check( 4, 7 ) =  0.498747493302027 ;
  circB_check( 5, 7 ) = -0.035368600833851 ;
  circB_check( 6, 7 ) = -0.454648713412841 ;
  circB_check( 7, 7 ) = -0.208073418273571 ;


  test_qpixl_frqi_check_matrix( circB.matrix() , circB_check  , 10*eps );



  std::vector< R > c = { 0.5 , 1 , 1.5 , 2 , 2.5 , 3 , 3.5 , 4 };

  auto circC = qpixl::frqi::compressedFRQICircuit( c ) ;  

  // matrix
  qclab::dense::SquareMatrix< R > circC_check( 16 ) ;

  circC_check(  0, 0 ) =    0.310272290281873 ;
  circC_check(  1, 0 ) =    0.169502524710522 ;
  circC_check(  2, 0 ) =    0.191025712185045 ;
  circC_check(  3, 0 ) =    0.297504919764693 ;
  circC_check(  4, 0 ) =    0.025009377490697 ;
  circC_check(  5, 0 ) =    0.352667734613656 ;
  circC_check(  6, 0 ) =   -0.147130125045907 ;
  circC_check(  7, 0 ) =    0.321485188311959 ;
  circC_check(  8, 0 ) =   -0.283247041628773 ;
  circC_check(  9, 0 ) =    0.211591855723580 ;
  circC_check( 10, 0 ) =   -0.350015203834987 ;
  circC_check( 11, 0 ) =    0.049893457330116 ;
  circC_check( 12, 0 ) =   -0.331087436935406 ;
  circC_check( 13, 0 ) =   -0.124020599512917 ;
  circC_check( 14, 0 ) =   -0.231097918395994 ;
  circC_check( 15, 0 ) =   -0.267570088225568 ;

  circC_check(  0, 1 ) =   -0.169502524710522 ;
  circC_check(  1, 1 ) =    0.310272290281873 ;
  circC_check(  2, 1 ) =   -0.297504919764693 ;
  circC_check(  3, 1 ) =    0.191025712185045 ;
  circC_check(  4, 1 ) =   -0.352667734613656 ;
  circC_check(  5, 1 ) =    0.025009377490697 ;
  circC_check(  6, 1 ) =   -0.321485188311959 ;
  circC_check(  7, 1 ) =   -0.147130125045907 ;
  circC_check(  8, 1 ) =   -0.211591855723580 ;
  circC_check(  9, 1 ) =   -0.283247041628773 ;
  circC_check( 10, 1 ) =   -0.049893457330116 ;
  circC_check( 11, 1 ) =   -0.350015203834987 ;
  circC_check( 12, 1 ) =    0.124020599512917 ;
  circC_check( 13, 1 ) =   -0.331087436935406 ;
  circC_check( 14, 1 ) =    0.267570088225568 ;
  circC_check( 15, 1 ) =   -0.231097918395994 ;

  circC_check(  0, 2 ) =    0.310272290281873 ;
  circC_check(  1, 2 ) =    0.169502524710522 ;
  circC_check(  2, 2 ) =   -0.191025712185045 ;
  circC_check(  3, 2 ) =   -0.297504919764693 ;
  circC_check(  4, 2 ) =    0.025009377490697 ;
  circC_check(  5, 2 ) =    0.352667734613656 ;
  circC_check(  6, 2 ) =    0.147130125045907 ;
  circC_check(  7, 2 ) =   -0.321485188311959 ;
  circC_check(  8, 2 ) =   -0.283247041628773 ;
  circC_check(  9, 2 ) =    0.211591855723580 ;
  circC_check( 10, 2 ) =    0.350015203834987 ;
  circC_check( 11, 2 ) =   -0.049893457330116 ;
  circC_check( 12, 2 ) =   -0.331087436935406 ;
  circC_check( 13, 2 ) =   -0.124020599512917 ;
  circC_check( 14, 2 ) =    0.231097918395994 ;
  circC_check( 15, 2 ) =    0.267570088225568 ;

  circC_check(  0, 3 ) =   -0.169502524710522 ;
  circC_check(  1, 3 ) =    0.310272290281873 ;
  circC_check(  2, 3 ) =    0.297504919764693 ;
  circC_check(  3, 3 ) =   -0.191025712185045 ;
  circC_check(  4, 3 ) =   -0.352667734613656 ;
  circC_check(  5, 3 ) =    0.025009377490697 ;
  circC_check(  6, 3 ) =    0.321485188311959 ;
  circC_check(  7, 3 ) =    0.147130125045907 ;
  circC_check(  8, 3 ) =   -0.211591855723580 ;
  circC_check(  9, 3 ) =   -0.283247041628773 ;
  circC_check( 10, 3 ) =    0.049893457330116 ;
  circC_check( 11, 3 ) =    0.350015203834987 ;
  circC_check( 12, 3 ) =    0.124020599512917 ;
  circC_check( 13, 3 ) =   -0.331087436935406 ;
  circC_check( 14, 3 ) =   -0.267570088225568 ;
  circC_check( 15, 3 ) =    0.231097918395994 ;

  circC_check(  0, 4 ) =    0.310272290281873 ;
  circC_check(  1, 4 ) =    0.169502524710522 ;
  circC_check(  2, 4 ) =    0.191025712185045 ;
  circC_check(  3, 4 ) =    0.297504919764693 ;
  circC_check(  4, 4 ) =   -0.025009377490697 ;
  circC_check(  5, 4 ) =   -0.352667734613656 ;
  circC_check(  6, 4 ) =    0.147130125045907 ;
  circC_check(  7, 4 ) =   -0.321485188311959 ;
  circC_check(  8, 4 ) =   -0.283247041628773 ;
  circC_check(  9, 4 ) =    0.211591855723580 ;
  circC_check( 10, 4 ) =   -0.350015203834987 ;
  circC_check( 11, 4 ) =    0.049893457330116 ;
  circC_check( 12, 4 ) =    0.331087436935406 ;
  circC_check( 13, 4 ) =    0.124020599512917 ;
  circC_check( 14, 4 ) =    0.231097918395994 ;
  circC_check( 15, 4 ) =    0.267570088225568 ;

  circC_check(  0, 5 ) =   -0.169502524710522 ;
  circC_check(  1, 5 ) =    0.310272290281873 ;
  circC_check(  2, 5 ) =   -0.297504919764693 ;
  circC_check(  3, 5 ) =    0.191025712185045 ;
  circC_check(  4, 5 ) =    0.352667734613656 ;
  circC_check(  5, 5 ) =   -0.025009377490697 ;
  circC_check(  6, 5 ) =    0.321485188311959 ;
  circC_check(  7, 5 ) =    0.147130125045907 ;
  circC_check(  8, 5 ) =   -0.211591855723580 ;
  circC_check(  9, 5 ) =   -0.283247041628773 ;
  circC_check( 10, 5 ) =   -0.049893457330116 ;
  circC_check( 11, 5 ) =   -0.350015203834987 ;
  circC_check( 12, 5 ) =   -0.124020599512917 ;
  circC_check( 13, 5 ) =    0.331087436935406 ;
  circC_check( 14, 5 ) =   -0.267570088225568 ;
  circC_check( 15, 5 ) =    0.231097918395994 ;

  circC_check(  0, 6 ) =    0.310272290281873 ;
  circC_check(  1, 6 ) =    0.169502524710522 ;
  circC_check(  2, 6 ) =   -0.191025712185045 ;
  circC_check(  3, 6 ) =   -0.297504919764693 ;
  circC_check(  4, 6 ) =   -0.025009377490697 ;
  circC_check(  5, 6 ) =   -0.352667734613656 ;
  circC_check(  6, 6 ) =   -0.147130125045907 ;
  circC_check(  7, 6 ) =    0.321485188311959 ;
  circC_check(  8, 6 ) =   -0.283247041628773 ;
  circC_check(  9, 6 ) =    0.211591855723580 ;
  circC_check( 10, 6 ) =    0.350015203834987 ;
  circC_check( 11, 6 ) =   -0.049893457330116 ;
  circC_check( 12, 6 ) =    0.331087436935406 ;
  circC_check( 13, 6 ) =    0.124020599512917 ;
  circC_check( 14, 6 ) =   -0.231097918395994 ;
  circC_check( 15, 6 ) =   -0.267570088225568 ;

  circC_check(  0, 7 ) =   -0.169502524710522 ;
  circC_check(  1, 7 ) =    0.310272290281873 ;
  circC_check(  2, 7 ) =    0.297504919764693 ;
  circC_check(  3, 7 ) =   -0.191025712185045 ;
  circC_check(  4, 7 ) =    0.352667734613656 ;
  circC_check(  5, 7 ) =   -0.025009377490697 ;
  circC_check(  6, 7 ) =   -0.321485188311959 ;
  circC_check(  7, 7 ) =   -0.147130125045907 ;
  circC_check(  8, 7 ) =   -0.211591855723580 ;
  circC_check(  9, 7 ) =   -0.283247041628773 ;
  circC_check( 10, 7 ) =    0.049893457330116 ;
  circC_check( 11, 7 ) =    0.350015203834987 ;
  circC_check( 12, 7 ) =   -0.124020599512917 ;
  circC_check( 13, 7 ) =    0.331087436935406 ;
  circC_check( 14, 7 ) =    0.267570088225568 ;
  circC_check( 15, 7 ) =   -0.231097918395994 ;

  circC_check(  0, 8 ) =    0.310272290281873 ;
  circC_check(  1, 8 ) =    0.169502524710522 ;
  circC_check(  2, 8 ) =    0.191025712185045 ;
  circC_check(  3, 8 ) =    0.297504919764693 ;
  circC_check(  4, 8 ) =    0.025009377490697 ;
  circC_check(  5, 8 ) =    0.352667734613656 ;
  circC_check(  6, 8 ) =   -0.147130125045907 ;
  circC_check(  7, 8 ) =    0.321485188311959 ;
  circC_check(  8, 8 ) =    0.283247041628773 ;
  circC_check(  9, 8 ) =   -0.211591855723580 ;
  circC_check( 10, 8 ) =    0.350015203834987 ;
  circC_check( 11, 8 ) =   -0.049893457330116 ;
  circC_check( 12, 8 ) =    0.331087436935406 ;
  circC_check( 13, 8 ) =    0.124020599512917 ;
  circC_check( 14, 8 ) =    0.231097918395994 ;
  circC_check( 15, 8 ) =    0.267570088225568 ;

  circC_check(  0, 9 ) =   -0.169502524710522 ;
  circC_check(  1, 9 ) =    0.310272290281873 ;
  circC_check(  2, 9 ) =   -0.297504919764693 ;
  circC_check(  3, 9 ) =    0.191025712185045 ;
  circC_check(  4, 9 ) =   -0.352667734613656 ;
  circC_check(  5, 9 ) =    0.025009377490697 ;
  circC_check(  6, 9 ) =   -0.321485188311959 ;
  circC_check(  7, 9 ) =   -0.147130125045907 ;
  circC_check(  8, 9 ) =    0.211591855723580 ;
  circC_check(  9, 9 ) =    0.283247041628773 ;
  circC_check( 10, 9 ) =    0.049893457330116 ;
  circC_check( 11, 9 ) =    0.350015203834987 ;
  circC_check( 12, 9 ) =   -0.124020599512917 ;
  circC_check( 13, 9 ) =    0.331087436935406 ;
  circC_check( 14, 9 ) =   -0.267570088225568 ;
  circC_check( 15, 9 ) =    0.231097918395994 ;

  circC_check(  0, 10 ) =    0.310272290281873 ;
  circC_check(  1, 10 ) =    0.169502524710522 ;
  circC_check(  2, 10 ) =   -0.191025712185045 ;
  circC_check(  3, 10 ) =   -0.297504919764693 ;
  circC_check(  4, 10 ) =    0.025009377490697 ;
  circC_check(  5, 10 ) =    0.352667734613656 ;
  circC_check(  6, 10 ) =    0.147130125045907 ;
  circC_check(  7, 10 ) =   -0.321485188311959 ;
  circC_check(  8, 10 ) =    0.283247041628773 ;
  circC_check(  9, 10 ) =   -0.211591855723580 ;
  circC_check( 10, 10 ) =   -0.350015203834987 ;
  circC_check( 11, 10 ) =    0.049893457330116 ;
  circC_check( 12, 10 ) =    0.331087436935406 ;
  circC_check( 13, 10 ) =    0.124020599512917 ;
  circC_check( 14, 10 ) =   -0.231097918395994 ;
  circC_check( 15, 10 ) =   -0.267570088225568 ;

  circC_check(  0, 11 ) =   -0.169502524710522 ;
  circC_check(  1, 11 ) =    0.310272290281873 ;
  circC_check(  2, 11 ) =    0.297504919764693 ;
  circC_check(  3, 11 ) =   -0.191025712185045 ;
  circC_check(  4, 11 ) =   -0.352667734613656 ;
  circC_check(  5, 11 ) =    0.025009377490697 ;
  circC_check(  6, 11 ) =    0.321485188311959 ;
  circC_check(  7, 11 ) =    0.147130125045907 ;
  circC_check(  8, 11 ) =    0.211591855723580 ;
  circC_check(  9, 11 ) =    0.283247041628773 ;
  circC_check( 10, 11 ) =   -0.049893457330116 ;
  circC_check( 11, 11 ) =   -0.350015203834987 ;
  circC_check( 12, 11 ) =   -0.124020599512917 ;
  circC_check( 13, 11 ) =    0.331087436935406 ;
  circC_check( 14, 11 ) =    0.267570088225568 ;
  circC_check( 15, 11 ) =   -0.231097918395994 ;

  circC_check(  0, 12 ) =    0.310272290281873 ;
  circC_check(  1, 12 ) =    0.169502524710522 ;
  circC_check(  2, 12 ) =    0.191025712185045 ;
  circC_check(  3, 12 ) =    0.297504919764693 ;
  circC_check(  4, 12 ) =   -0.025009377490697 ;
  circC_check(  5, 12 ) =   -0.352667734613656 ;
  circC_check(  6, 12 ) =    0.147130125045907 ;
  circC_check(  7, 12 ) =   -0.321485188311959 ;
  circC_check(  8, 12 ) =    0.283247041628773 ;
  circC_check(  9, 12 ) =   -0.211591855723580 ;
  circC_check( 10, 12 ) =    0.350015203834987 ;
  circC_check( 11, 12 ) =   -0.049893457330116 ;
  circC_check( 12, 12 ) =   -0.331087436935406 ;
  circC_check( 13, 12 ) =   -0.124020599512917 ;
  circC_check( 14, 12 ) =   -0.231097918395994 ;
  circC_check( 15, 12 ) =   -0.267570088225568 ;

  circC_check(  0, 13 ) =   -0.169502524710522 ;
  circC_check(  1, 13 ) =    0.310272290281873 ;
  circC_check(  2, 13 ) =   -0.297504919764693 ;
  circC_check(  3, 13 ) =    0.191025712185045 ;
  circC_check(  4, 13 ) =    0.352667734613656 ;
  circC_check(  5, 13 ) =   -0.025009377490697 ;
  circC_check(  6, 13 ) =    0.321485188311959 ;
  circC_check(  7, 13 ) =    0.147130125045907 ;
  circC_check(  8, 13 ) =    0.211591855723580 ;
  circC_check(  9, 13 ) =    0.283247041628773 ;
  circC_check( 10, 13 ) =    0.049893457330116 ;
  circC_check( 11, 13 ) =    0.350015203834987 ;
  circC_check( 12, 13 ) =    0.124020599512917 ;
  circC_check( 13, 13 ) =   -0.331087436935406 ;
  circC_check( 14, 13 ) =    0.267570088225568 ;
  circC_check( 15, 13 ) =   -0.231097918395994 ;

  circC_check(  0, 14 ) =    0.310272290281873 ;
  circC_check(  1, 14 ) =    0.169502524710522 ;
  circC_check(  2, 14 ) =   -0.191025712185045 ;
  circC_check(  3, 14 ) =   -0.297504919764693 ;
  circC_check(  4, 14 ) =   -0.025009377490697 ;
  circC_check(  5, 14 ) =   -0.352667734613656 ;
  circC_check(  6, 14 ) =   -0.147130125045907 ;
  circC_check(  7, 14 ) =    0.321485188311959 ;
  circC_check(  8, 14 ) =    0.283247041628773 ;
  circC_check(  9, 14 ) =   -0.211591855723580 ;
  circC_check( 10, 14 ) =   -0.350015203834987 ;
  circC_check( 11, 14 ) =    0.049893457330116 ;
  circC_check( 12, 14 ) =   -0.331087436935406 ;
  circC_check( 13, 14 ) =   -0.124020599512917 ;
  circC_check( 14, 14 ) =    0.231097918395994 ;
  circC_check( 15, 14 ) =    0.267570088225568 ;

  circC_check(  0, 15 ) =   -0.169502524710522 ;
  circC_check(  1, 15 ) =    0.310272290281873 ;
  circC_check(  2, 15 ) =    0.297504919764693 ;
  circC_check(  3, 15 ) =   -0.191025712185045 ;
  circC_check(  4, 15 ) =    0.352667734613656 ;
  circC_check(  5, 15 ) =   -0.025009377490697 ;
  circC_check(  6, 15 ) =   -0.321485188311959 ;
  circC_check(  7, 15 ) =   -0.147130125045907 ;
  circC_check(  8, 15 ) =    0.211591855723580 ;
  circC_check(  9, 15 ) =    0.283247041628773 ;
  circC_check( 10, 15 ) =   -0.049893457330116 ;
  circC_check( 11, 15 ) =   -0.350015203834987 ;
  circC_check( 12, 15 ) =    0.124020599512917 ;
  circC_check( 13, 15 ) =   -0.331087436935406 ;
  circC_check( 14, 15 ) =   -0.267570088225568 ;
  circC_check( 15, 15 ) =    0.231097918395994 ;

  test_qpixl_frqi_check_matrix( circC.matrix() , circC_check  , 10*eps );
}